

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_renumber.cc
# Opt level: O0

bool compare_xref_table(map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                        *a,map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                           *b)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  reference this;
  long lVar7;
  long lVar8;
  QPDFXRefEntry xref_b;
  QPDFXRefEntry xref_a;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *b_local;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *a_local;
  
  sVar4 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::size(a);
  sVar5 = std::
          map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
          ::size(b);
  if (sVar4 == sVar5) {
    __end1 = std::
             map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::begin(a);
    iter = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
           std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::end(a);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
      this = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*(&__end1)
      ;
      poVar6 = std::operator<<((ostream *)&std::cout,"xref entry for ");
      iVar2 = QPDFObjGen::getObj(&this->first);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6,"/");
      iVar2 = QPDFObjGen::getGen(&this->first);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      sVar4 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count(b,&this->first);
      if (sVar4 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"not found");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return false;
      }
      std::
      map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
      ::operator[](b,&this->first);
      iVar2 = QPDFXRefEntry::getType();
      iVar3 = QPDFXRefEntry::getType();
      if (iVar2 != iVar3) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"different xref entry type");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        return false;
      }
      iVar2 = QPDFXRefEntry::getType();
      if (iVar2 != 0) {
        if (iVar2 == 1) {
          lVar7 = QPDFXRefEntry::getOffset();
          lVar8 = QPDFXRefEntry::getOffset();
          if (lVar7 != lVar8) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"different offset");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            return false;
          }
        }
        else {
          if (iVar2 != 2) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"unknown xref entry type");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            exit(2);
          }
          iVar2 = QPDFXRefEntry::getObjStreamNumber();
          iVar3 = QPDFXRefEntry::getObjStreamNumber();
          if (iVar2 != iVar3) {
LAB_0010631c:
            poVar6 = std::operator<<((ostream *)&std::cerr,"different stream number or index");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            return false;
          }
          iVar2 = QPDFXRefEntry::getObjStreamIndex();
          iVar3 = QPDFXRefEntry::getObjStreamIndex();
          if (iVar2 != iVar3) goto LAB_0010631c;
        }
      }
      std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
    }
    a_local._7_1_ = true;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"different size");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool
compare_xref_table(std::map<QPDFObjGen, QPDFXRefEntry> a, std::map<QPDFObjGen, QPDFXRefEntry> b)
{
    if (a.size() != b.size()) {
        std::cerr << "different size" << std::endl;
        return false;
    }

    for (auto const& iter: a) {
        std::cout << "xref entry for " << iter.first.getObj() << "/" << iter.first.getGen()
                  << std::endl;

        if (b.count(iter.first) == 0) {
            std::cerr << "not found" << std::endl;
            return false;
        }

        QPDFXRefEntry xref_a = iter.second;
        QPDFXRefEntry xref_b = b[iter.first];
        if (xref_a.getType() != xref_b.getType()) {
            std::cerr << "different xref entry type" << std::endl;
            return false;
        }

        switch (xref_a.getType()) {
        case 0:
            break;
        case 1:
            if (xref_a.getOffset() != xref_a.getOffset()) {
                std::cerr << "different offset" << std::endl;
                return false;
            }
            break;
        case 2:
            if (xref_a.getObjStreamNumber() != xref_a.getObjStreamNumber() ||
                xref_a.getObjStreamIndex() != xref_a.getObjStreamIndex()) {
                std::cerr << "different stream number or index" << std::endl;
                return false;
            }
            break;
        default:
            std::cerr << "unknown xref entry type" << std::endl;
            std::exit(2);
        }
    }

    return true;
}